

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

void __thiscall ev3dev::led::off(led *this)

{
  string local_30 [40];
  
  set_brightness((led *)local_30,this,0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void off() { set_brightness(0); }